

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O1

InternalParseResult * __thiscall
clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *this_00;
  pointer pOVar2;
  pointer pAVar3;
  long *plVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  ulong *puVar13;
  ulong uVar14;
  const_iterator __begin3_1;
  pointer pAVar15;
  ulong uVar16;
  long lVar17;
  const_iterator __begin3;
  pointer pOVar18;
  BasicResult<clara::detail::ParseState> result;
  ParserInfo parseInfos [512];
  undefined1 local_2178 [64];
  char *local_2138;
  size_type local_2130;
  char local_2128;
  undefined7 uStack_2127;
  undefined8 uStack_2120;
  vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *local_2118;
  string *local_2110;
  undefined1 local_2108 [16];
  undefined1 local_20f8 [32];
  undefined1 local_20d8 [16];
  undefined1 auStack_20c8 [24];
  vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> local_20b0;
  long *local_2098 [2];
  long local_2088 [2];
  Iterator *local_2078;
  ulong local_2070;
  ParserResult local_2068;
  ulong local_2038 [1025];
  
  pOVar18 = (this->m_options).
            super__Vector_base<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar2 = (this->m_options).
           super__Vector_base<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar3 = (this->m_args).
           super__Vector_base<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar15 = (this->m_args).
            super__Vector_base<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_2070 = ((long)pAVar3 - (long)pAVar15 >> 5) * -0x5555555555555555 +
               ((long)pOVar2 - (long)pOVar18 >> 3) * -0x1111111111111111;
  local_2110 = exeName;
  if (0x1ff < local_2070) {
    __assert_fail("totalParsers < 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/FuzzTests/clara.hpp"
                  ,0x49c,
                  "virtual InternalParseResult clara::detail::Parser::parse(const std::string &, const TokenStream &) const"
                 );
  }
  puVar13 = local_2038;
  lVar17 = 0;
  memset(puVar13,0,0x2000);
  if (pOVar18 != pOVar2) {
    lVar17 = 0;
    do {
      lVar17 = lVar17 + 1;
      *puVar13 = (ulong)pOVar18;
      pOVar18 = pOVar18 + 1;
      puVar13 = puVar13 + 2;
    } while (pOVar18 != pOVar2);
  }
  if (pAVar15 != pAVar3) {
    puVar13 = local_2038 + lVar17 * 2;
    do {
      *puVar13 = (ulong)pAVar15;
      pAVar15 = pAVar15 + 1;
      puVar13 = puVar13 + 2;
    } while (pAVar15 != pAVar3);
  }
  ExeName::set(&local_2068,&this->m_exeName,local_2110);
  local_2068.super_ResultValueBase<clara::detail::ParseResultType>.super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_00153398;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2068.m_errorMessage._M_dataplus._M_p != &local_2068.m_errorMessage.field_2) {
    operator_delete(local_2068.m_errorMessage._M_dataplus._M_p,
                    local_2068.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  local_2068.super_ResultValueBase<clara::detail::ParseResultType>.super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__ResultValueBase_00153400;
  this_00 = (vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
            (auStack_20c8 + 8);
  local_20d8._0_4_ = 1;
  local_20d8._8_8_ = (tokens->it)._M_current;
  auStack_20c8._0_8_ = (tokens->itEnd)._M_current;
  std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::vector
            (this_00,&tokens->m_tokenBuffer);
  local_2178._8_4_ = Ok;
  local_2178._0_8_ = &PTR__ResultValueBase_00153538;
  local_2178._16_4_ = local_20d8._0_4_;
  local_2178._24_8_ = local_20d8._8_8_;
  local_2178._32_8_ = auStack_20c8._0_8_;
  std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::vector
            ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
             (local_2178 + 0x28),this_00);
  local_2178._0_8_ = &PTR__BasicResult_001534e0;
  local_2138 = &local_2128;
  local_2130 = 0;
  local_2128 = '\0';
  std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::~vector(this_00);
  paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
  local_2078 = (Iterator *)
               ((long)&(__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).
                       field_0 + 8);
  local_2118 = &(__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).field_0.
                m_value.m_remainingTokens.m_tokenBuffer;
  do {
    (**(_func_int **)(local_2178._0_8_ + 0x10))
              ((ResultValueBase<clara::detail::ParseState> *)local_2178);
    local_20d8._0_8_ = local_2178._24_8_;
    local_20d8._8_8_ = local_2178._32_8_;
    std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::vector
              ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)auStack_20c8,
               (vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
               (local_2178 + 0x28));
    uVar11 = auStack_20c8._8_8_;
    uVar10 = auStack_20c8._0_8_;
    uVar9 = local_20d8._8_8_;
    uVar8 = local_20d8._0_8_;
    std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::~vector
              ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)auStack_20c8);
    if ((uVar10 == uVar11) && (uVar8 == uVar9)) {
      (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
      _vptr_ResultBase = (_func_int **)&PTR__ResultBase_00153428;
      (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
      m_type = local_2178._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
      _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00153538;
      if (local_2178._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).field_0.m_value.
        m_type = local_2178._16_4_;
        (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).field_0.m_value.
        m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).field_0.m_value.
        m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2178._32_8_;
        std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::vector
                  (local_2118,
                   (vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
                   (local_2178 + 0x28));
      }
      (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
      _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001534e0;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_2138 == &local_2128) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_2127,local_2128);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_2120;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2138;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             CONCAT71(uStack_2127,local_2128);
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2130;
      local_2130 = 0;
      local_2128 = '\0';
      local_2138 = &local_2128;
      break;
    }
    if (local_2070 == 0) {
      iVar12 = 8;
      bVar7 = false;
    }
    else {
      bVar7 = false;
      puVar13 = local_2038 + 1;
      uVar16 = local_2070;
      do {
        plVar4 = (long *)puVar13[-1];
        lVar17 = (**(code **)(*plVar4 + 0x20))(plVar4);
        if ((lVar17 == 0) ||
           (uVar5 = *puVar13, uVar14 = (**(code **)(*plVar4 + 0x20))(plVar4), uVar5 < uVar14)) {
          (**(_func_int **)(local_2178._0_8_ + 0x10))
                    ((ResultValueBase<clara::detail::ParseState> *)local_2178);
          local_2108._0_8_ = local_2178._24_8_;
          local_2108._8_8_ = local_2178._32_8_;
          std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::vector
                    ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
                     local_20f8,
                     (vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
                     (local_2178 + 0x28));
          (**(code **)(*plVar4 + 0x18))
                    ((ResultValueBase<clara::detail::ParseState> *)local_20d8,plVar4,local_2110,
                     local_2108);
          ResultValueBase<clara::detail::ParseState>::operator=
                    ((ResultValueBase<clara::detail::ParseState> *)local_2178,
                     (ResultValueBase<clara::detail::ParseState> *)local_20d8);
          std::__cxx11::string::operator=((string *)&local_2138,(string *)local_2098);
          local_20d8._0_8_ = &PTR__BasicResult_001534e0;
          if (local_2098[0] != local_2088) {
            operator_delete(local_2098[0],local_2088[0] + 1);
          }
          local_20d8._0_8_ = &PTR__ResultValueBase_00153538;
          if (local_20d8._8_4_ == Ok) {
            std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::~vector
                      (&local_20b0);
          }
          std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::~vector
                    ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
                     local_20f8);
          if (local_2178._8_4_ == Ok) {
            (**(_func_int **)(local_2178._0_8_ + 0x10))
                      ((ResultValueBase<clara::detail::ParseState> *)local_2178);
            if (local_2178._16_4_ == NoMatch) goto LAB_0010bce0;
            *puVar13 = *puVar13 + 1;
            iVar12 = 8;
            bVar7 = true;
          }
          else {
            (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).
            super_ResultBase.m_type = local_2178._8_4_;
            (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).
            super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001534e0;
            (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
            if (local_2138 == &local_2128) {
              paVar1->_M_allocated_capacity = CONCAT71(uStack_2127,local_2128);
              *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
                   uStack_2120;
            }
            else {
              (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2138;
              (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
                   CONCAT71(uStack_2127,local_2128);
            }
            (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2130;
            local_2130 = 0;
            local_2128 = '\0';
            iVar12 = 1;
            local_2138 = &local_2128;
          }
          bVar6 = false;
        }
        else {
LAB_0010bce0:
          iVar12 = 0;
          bVar6 = true;
        }
        if (!bVar6) goto LAB_0010bd44;
        puVar13 = puVar13 + 2;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
      iVar12 = 8;
    }
LAB_0010bd44:
    if (iVar12 == 8) {
      (**(_func_int **)(local_2178._0_8_ + 0x10))
                ((ResultValueBase<clara::detail::ParseState> *)local_2178);
      if (local_2178._16_4_ == ShortCircuitAll) {
        (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
        _vptr_ResultBase = (_func_int **)&PTR__ResultBase_00153428;
        (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
        m_type = local_2178._8_4_;
        (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
        _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00153538;
        if (local_2178._8_4_ == Ok) {
          (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).field_0.m_value
          .m_type = ShortCircuitAll;
          local_2078->_M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2178._24_8_;
          local_2078[1]._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2178._32_8_;
          std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::vector
                    (local_2118,
                     (vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
                     (local_2178 + 0x28));
        }
        (__return_storage_ptr__->super_ResultValueBase<clara::detail::ParseState>).super_ResultBase.
        _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001534e0;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
        if (local_2138 == &local_2128) {
          paVar1->_M_allocated_capacity = CONCAT71(uStack_2127,local_2128);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_2120
          ;
        }
        else {
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2138;
          (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
               CONCAT71(uStack_2127,local_2128);
        }
        (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2130;
        local_2130 = 0;
        local_2128 = '\0';
        local_2138 = &local_2128;
      }
      else {
        iVar12 = 0;
        if (bVar7) goto LAB_0010bed6;
        (**(_func_int **)(local_2178._0_8_ + 0x10))
                  ((ResultValueBase<clara::detail::ParseState> *)local_2178);
        local_20d8._0_8_ = local_2178._24_8_;
        local_20d8._8_8_ = local_2178._32_8_;
        std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::vector
                  ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
                   auStack_20c8,
                   (vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
                   (local_2178 + 0x28));
        if (auStack_20c8._0_8_ == auStack_20c8._8_8_) {
          __assert_fail("!m_tokenBuffer.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/FuzzTests/clara.hpp"
                        ,0x1eb,"const Token *clara::detail::TokenStream::operator->() const");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2108,"Unrecognised token: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (auStack_20c8._0_8_ + 8));
        BasicResult<clara::detail::ParseState>::BasicResult
                  (__return_storage_ptr__,RuntimeError,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2108);
        if ((pointer)local_2108._0_8_ != (pointer)local_20f8) {
          operator_delete((void *)local_2108._0_8_,(ulong)(local_20f8._0_8_ + 1));
        }
        std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::~vector
                  ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
                   auStack_20c8);
      }
      iVar12 = 1;
    }
LAB_0010bed6:
  } while (iVar12 == 0);
  local_2178._0_8_ = &PTR__BasicResult_001534e0;
  if (local_2138 != &local_2128) {
    operator_delete(local_2138,CONCAT71(uStack_2127,local_2128) + 1);
  }
  local_2178._0_8_ = &PTR__ResultValueBase_00153538;
  if (local_2178._8_4_ == Ok) {
    std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::~vector
              ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
               (local_2178 + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }